

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::ban_peer(torrent *this,torrent_peer *tp)

{
  bool bVar1;
  session_settings *this_00;
  pointer this_01;
  torrent_peer *tp_local;
  torrent *this_local;
  
  this_00 = settings(this);
  bVar1 = session_settings::get_bool(this_00,0x8032);
  if ((bVar1) || (-1 < *(int *)&tp->field_0x1b)) {
    need_peer_list(this);
    this_01 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    bVar1 = peer_list::ban_peer(this_01,tp);
    if (bVar1) {
      update_want_peers(this);
      inc_stats_counter(this,0x31,1);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool torrent::ban_peer(torrent_peer* tp)
	{
		if (!settings().get_bool(settings_pack::ban_web_seeds) && tp->web_seed)
			return false;

		need_peer_list();
		if (!m_peer_list->ban_peer(tp)) return false;
		update_want_peers();

		inc_stats_counter(counters::num_banned_peers);
		return true;
	}